

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseCommon.cpp
# Opt level: O1

void __thiscall
siamese::GrowingAlignedByteMatrix::Free(GrowingAlignedByteMatrix *this,Allocator *allocator)

{
  if (this->Data != (uint8_t *)0x0) {
    pktalloc::Allocator::Free(allocator,this->Data);
    this->Data = (uint8_t *)0x0;
    this->AllocatedRows = 0;
    this->AllocatedColumns = 0;
  }
  return;
}

Assistant:

void GrowingAlignedByteMatrix::Free(pktalloc::Allocator* allocator)
{
    SIAMESE_DEBUG_ASSERT(allocator);
    if (Data)
    {
        allocator->Free(Data);
        Data             = nullptr;
        AllocatedRows    = 0;
        AllocatedColumns = 0;
    }
}